

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

Maybe<unsigned_long> __thiscall
kj::HashIndex<kj::HashMap<kj::StringPtr,capnp::StructSchema::Field>::Callbacks>::
find<kj::HashMap<kj::StringPtr,capnp::StructSchema::Field>::Entry_const,capnp::Text::Reader&>
          (HashIndex<kj::HashMap<kj::StringPtr,capnp::StructSchema::Field>::Callbacks> *this,
          ArrayPtr<const_kj::HashMap<kj::StringPtr,_capnp::StructSchema::Field>::Entry> table,
          Reader *params)

{
  RawBrandedSchema *pRVar1;
  void *__s2;
  long lVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  RawSchema **ppRVar7;
  long lVar8;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar9;
  Entry *pEVar10;
  undefined8 *in_R8;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  ArrayPtr<const_unsigned_char> s;
  Maybe<unsigned_long> MVar14;
  Maybe<unsigned_long> MVar15;
  
  MVar15.ptr.field_1.value = table.size_;
  pEVar10 = table.ptr;
  if (*(long *)&(pEVar10->value).index == 0) {
    *this = (HashIndex<kj::HashMap<kj::StringPtr,capnp::StructSchema::Field>::Callbacks>)0x0;
    MVar15.ptr._0_8_ = this;
    return (Maybe<unsigned_long>)MVar15.ptr;
  }
  s.size_ = in_R8[1] - 1;
  s.ptr = (uchar *)*in_R8;
  uVar4 = kj::_::HashCoder::operator*((HashCoder *)&kj::_::HASHCODER,s);
  uVar5 = kj::_::chooseBucket((uint)(uVar4 != 0),(pEVar10->value).index);
  pRVar1 = (pEVar10->value).parent.super_Schema.raw;
  uVar13 = (ulong)uVar5;
  uVar11 = *(uint *)((long)&pRVar1->generic + uVar13 * 8 + 4);
  aVar9 = extraout_RDX;
  if (uVar11 != 0) {
    ppRVar7 = &pRVar1->generic + uVar13;
    __s2 = (void *)*in_R8;
    lVar2 = in_R8[1];
    uVar3 = *(ulong *)&(pEVar10->value).index;
    do {
      if ((uVar11 != 1) && (*(uint *)ppRVar7 == (uint)(uVar4 != 0))) {
        lVar8 = (ulong)(uVar11 - 2) * 0x50;
        if (*(long *)(MVar15.ptr.field_1.value + 8 + lVar8) == lVar2) {
          iVar6 = bcmp(*(void **)(lVar8 + MVar15.ptr.field_1.value),__s2,lVar2 - 1);
          aVar9.value = 0;
          if (iVar6 == 0) {
            *this = (HashIndex<kj::HashMap<kj::StringPtr,capnp::StructSchema::Field>::Callbacks>)0x1
            ;
            *(ulong *)(this + 8) = (ulong)(uVar11 - 2);
            goto LAB_001f2896;
          }
        }
      }
      aVar9.value = 0;
      uVar12 = uVar13 + 1;
      uVar13 = uVar12 & 0xffffffff;
      if (uVar12 == uVar3) {
        uVar13 = 0;
      }
      ppRVar7 = &pRVar1->generic + uVar13;
      uVar11 = *(uint *)((long)ppRVar7 + 4);
    } while (uVar11 != 0);
  }
  *this = (HashIndex<kj::HashMap<kj::StringPtr,capnp::StructSchema::Field>::Callbacks>)0x0;
LAB_001f2896:
  MVar14.ptr.field_1.value = aVar9.value;
  MVar14.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar14.ptr;
}

Assistant:

Maybe<size_t> find(kj::ArrayPtr<Row> table, Params&&... params) const {
    if (buckets.size() == 0) return nullptr;

    uint hashCode = cb.hashCode(params...);
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // not found.
        return nullptr;
      } else if (bucket.isErased()) {
        // skip, keep searching
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // found
        return size_t(bucket.getPos());
      }
    }
  }